

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QString * __thiscall QLocaleData::percentSign(QString *__return_storage_ptr__,QLocaleData *this)

{
  long in_FS_OFFSET;
  DataRange local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = (DataRange)((ulong)this->m_percent_size << 0x20 | (ulong)this->m_percent_idx);
  DataRange::getData(__return_storage_ptr__,&local_18,
                     L".,%0-+e\"\'\xa0E«»„“”‘’‚‹›٫٬٪\x061c٠\x061c-\x061c+أس\x200e%\x200e\x200e-\x200e+০۰\x200e+\x200e×۱۰^−०၀「」『』\x200f-\x200f+اس𑄶×10^༠\x202f⹁𞥐𞤉ወ꯰،߀·10^\x200e−᱐Е"
                    );
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocaleData::percentSign() const
{
    return percent().getData(single_character_data);
}